

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
slang::driver::Driver::runPreprocessor
          (Driver *this,bool includeComments,bool includeDirectives,bool obfuscateIds,
          bool useFixedObfuscationSeed)

{
  string_view text;
  string_view text_00;
  SourceBuffer buffer;
  Token token_00;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  reference pSVar2;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paVar3;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  iterator pDVar5;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  byte in_R8B;
  Token TVar6;
  string_view sVar7;
  Token TVar8;
  __sv_type _Var9;
  Diagnostic *diag;
  iterator __end2;
  iterator __begin2;
  Diagnostics *__range2;
  string newName;
  iterator translation;
  string name;
  Token token;
  flat_hash_map<std::string,_std::string> obfuscationMap;
  optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  rng;
  SyntaxPrinter output;
  reverse_iterator it;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  Preprocessor preprocessor;
  Diagnostics diagnostics;
  BumpAllocator alloc;
  Bag optionBag;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  SyntaxPrinter *this_01;
  BumpAllocator *in_stack_ffffffffffffccb0;
  Preprocessor *this_02;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffccb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffccc0;
  try_emplace_args_t *in_stack_ffffffffffffccc8;
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffccd0;
  undefined7 in_stack_ffffffffffffccd8;
  undefined1 in_stack_ffffffffffffccdf;
  Preprocessor *in_stack_ffffffffffffcce0;
  undefined8 in_stack_ffffffffffffcce8;
  BumpAllocator *alloc_00;
  undefined7 in_stack_ffffffffffffccf0;
  undefined1 in_stack_ffffffffffffccf7;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffccf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcd00;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffcd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  try_emplace_args_t *args_01;
  try_emplace_args_t *ptVar11;
  try_emplace_args_t *hash_00;
  SourceLoader *in_stack_ffffffffffffcda8;
  undefined1 local_31c0 [16];
  SyntaxPrinter *in_stack_ffffffffffffce50;
  undefined8 in_stack_ffffffffffffce58;
  Info *in_stack_ffffffffffffce60;
  char *pcVar12;
  undefined1 local_3190 [24];
  SourceManager *in_stack_ffffffffffffce88;
  span<const_slang::Diagnostic,_18446744073709551615UL> in_stack_ffffffffffffce90;
  undefined1 local_3148 [32];
  char *local_3128;
  undefined8 local_3120;
  undefined1 local_3118 [32];
  size_t local_30f8;
  unsigned_long_long in_stack_ffffffffffffcf10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffcf18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar13;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_3098;
  undefined1 local_3080 [48];
  char_pointer local_3050;
  table_element_pointer local_3048;
  allocator<char> local_3039;
  string_view local_3038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3028;
  Token local_3008;
  Token local_2ff8;
  Token local_2fe8;
  Bag *in_stack_ffffffffffffd1f8;
  Diagnostics *in_stack_ffffffffffffd200;
  BumpAllocator *in_stack_ffffffffffffd208;
  SourceManager *in_stack_ffffffffffffd210;
  Preprocessor *in_stack_ffffffffffffd218;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_ffffffffffffd390;
  Bag *in_stack_ffffffffffffd458;
  Driver *in_stack_ffffffffffffd460;
  try_emplace_args_t local_1c50 [8];
  size_t local_1c48;
  SyntaxPrinter local_890;
  SyntaxPrinter *local_858;
  Preprocessor *pPStack_850;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_840;
  SyntaxPrinter *local_808;
  Preprocessor *pPStack_800;
  SmallVectorBase<slang::Diagnostic> local_460 [2];
  byte local_314;
  byte local_313;
  byte local_312;
  byte local_311;
  byte local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  try_emplace_args_t *local_2f8;
  char_pointer local_2f0;
  table_element_pointer local_2e8;
  SyntaxPrinter *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  try_emplace_args_t *local_2d0;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  undefined8 uStack_2a0;
  undefined1 *local_298;
  char *local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined1 *local_260;
  char *local_258;
  undefined8 uStack_250;
  undefined1 *local_240;
  char *local_238;
  undefined8 uStack_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined8 *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  try_emplace_args_t *local_1e0;
  iterator local_1d8;
  size_t local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  try_emplace_args_t *local_1b8;
  uint local_1ac;
  value_type *local_1a8;
  value_type *local_1a0;
  uint local_194;
  group_type *local_190;
  size_t local_188;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  try_emplace_args_t *local_158;
  undefined1 local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  SyntaxPrinter *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 *local_70;
  try_emplace_args_t *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  try_emplace_args_t *local_8;
  
  local_311 = in_SIL & 1;
  local_312 = in_DL & 1;
  local_313 = in_CL & 1;
  local_314 = in_R8B & 1;
  Bag::Bag((Bag *)0x1cb390);
  addParseOptions(in_stack_ffffffffffffd460,in_stack_ffffffffffffd458);
  BumpAllocator::BumpAllocator(in_stack_ffffffffffffccb0);
  Diagnostics::Diagnostics((Diagnostics *)0x1cb3cb);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x1cb3ee);
  parsing::Preprocessor::Preprocessor
            (in_stack_ffffffffffffd218,in_stack_ffffffffffffd210,in_stack_ffffffffffffd208,
             in_stack_ffffffffffffd200,in_stack_ffffffffffffd1f8,in_stack_ffffffffffffd390);
  SourceLoader::loadSources(in_stack_ffffffffffffcda8);
  std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::rbegin
            ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)
             in_stack_ffffffffffffccb8);
  this_01 = local_808;
  this_02 = pPStack_800;
  while( true ) {
    std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::rend
              ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)
               in_stack_ffffffffffffccb8);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                        *)in_stack_ffffffffffffccc0,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                        *)in_stack_ffffffffffffccb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                          *)this_02);
    this_01 = (SyntaxPrinter *)(pSVar2->data)._M_len;
    this_02 = (Preprocessor *)(pSVar2->data)._M_str;
    in_stack_ffffffffffffccb8 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)pSVar2->library;
    in_stack_ffffffffffffccc0 =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&pSVar2->id;
    buffer.data._M_len._7_1_ = in_stack_ffffffffffffccf7;
    buffer.data._M_len._0_7_ = in_stack_ffffffffffffccf0;
    buffer.data._M_str = (char *)in_stack_ffffffffffffccf8;
    buffer.library = (SourceLibrary *)in_stack_ffffffffffffcd00;
    buffer._24_8_ = in_stack_ffffffffffffcd08;
    local_858 = this_01;
    pPStack_850 = this_02;
    local_848 = in_stack_ffffffffffffccb8;
    pbStack_840 = in_stack_ffffffffffffccc0;
    parsing::Preprocessor::pushSource(in_stack_ffffffffffffcce0,buffer);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<slang::SourceBuffer_*,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                  *)in_stack_ffffffffffffccb8,(int)((ulong)this_02 >> 0x20));
  }
  slang::syntax::SyntaxPrinter::SyntaxPrinter((SyntaxPrinter *)this_02);
  slang::syntax::SyntaxPrinter::setIncludeComments(&local_890,(bool)(local_311 & 1));
  slang::syntax::SyntaxPrinter::setIncludeDirectives(&local_890,(bool)(local_312 & 1));
  std::
  optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::optional((optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
              *)0x1cb5e4);
  boost::unordered::
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_flat_map(in_stack_ffffffffffffccd0);
  if ((local_313 & 1) != 0) {
    if ((local_314 & 1) == 0) {
      createRandomGenerator<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                ();
      std::
      optional<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
      ::operator=((optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                   *)in_stack_ffffffffffffccc0,in_stack_ffffffffffffccb8);
    }
    else {
      std::
      optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
      ::emplace<>((optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                   *)this_02);
    }
  }
  TVar8.info = (Info *)in_stack_ffffffffffffcce0;
  TVar8.kind = (short)in_stack_ffffffffffffcce8;
  TVar8._2_1_ = (char)((ulong)in_stack_ffffffffffffcce8 >> 0x10);
  TVar8.numFlags.raw = (char)((ulong)in_stack_ffffffffffffcce8 >> 0x18);
  TVar8.rawLen = (int)((ulong)in_stack_ffffffffffffcce8 >> 0x20);
  do {
    TVar6 = parsing::Preprocessor::next((Preprocessor *)0x1cb681);
    local_2fe8.kind = TVar6.kind;
    bVar1 = local_2fe8.kind == IntegerBase;
    local_2fe8 = TVar6;
    if (bVar1) {
      do {
        token_00.info = in_stack_ffffffffffffce60;
        token_00.kind = (short)in_stack_ffffffffffffce58;
        token_00._2_1_ = (char)((ulong)in_stack_ffffffffffffce58 >> 0x10);
        token_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffce58 >> 0x18);
        token_00.rawLen = (int)((ulong)in_stack_ffffffffffffce58 >> 0x20);
        local_2fe8 = TVar6;
        local_2ff8 = TVar6;
        slang::syntax::SyntaxPrinter::print(in_stack_ffffffffffffce50,token_00);
        TVar6 = parsing::Preprocessor::next((Preprocessor *)0x1cb700);
        local_2fe8.kind = TVar6.kind;
        local_3008 = TVar6;
        bVar1 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_2fe8.kind);
        local_2fe8 = TVar6;
        TVar6 = local_2fe8;
      } while (bVar1);
    }
    if (((local_313 & 1) != 0) && (local_2fe8.kind == Identifier)) {
      sVar7 = parsing::Token::valueText((Token *)in_stack_ffffffffffffccc0);
      local_3038 = sVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffccf7,in_stack_ffffffffffffccf0),TVar8._0_8_,
                 (allocator<char> *)TVar8.info);
      std::allocator<char>::~allocator(&local_3039);
      local_300 = &local_3028;
      local_2f8 = local_1c50;
      local_1e8 = local_300;
      local_1e0 = local_1c50;
      local_1c0 = local_300;
      local_1b8 = local_1c50;
      local_1c8 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::hash_for<std::__cxx11::string>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)this_02,&this_01->buffer);
      pbVar10 = local_1c0;
      local_168 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)this_02,(size_t)this_01);
      local_160 = pbVar10;
      local_170 = local_1c8;
      local_158 = local_1c50;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_180,local_168);
      do {
        local_188 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_180);
        local_190 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::groups((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x1cb965);
        local_190 = local_190 + local_188;
        local_194 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_ffffffffffffccb8,(size_t)this_02);
        if (local_194 != 0) {
          local_1a0 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::elements((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)0x1cb9c3);
          local_1a8 = local_1a0 + local_188 * 0xf;
          do {
            local_1ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x1cba16);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::key_from<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x1cba49);
            bVar1 = std::
                    equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)this_02,&this_01->buffer,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x1cba70);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::table_locator(&local_200,local_190,local_1ac,local_1a8 + local_1ac);
              goto LAB_001cbb65;
            }
            local_194 = local_194 - 1 & local_194;
          } while (local_194 != 0);
        }
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)this_02,
                           (size_t)this_01);
        if (bVar1) {
          memset(&local_200,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::table_locator(&local_200);
          goto LAB_001cbb65;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_180,local_1c48);
      } while (bVar1);
      memset(&local_200,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::table_locator(&local_200);
LAB_001cbb65:
      local_1d8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::make_iterator((locator *)0x1cbb76);
      local_2f0 = local_1d8.pc_;
      local_2e8 = local_1d8.p_;
      local_3050 = local_1d8.pc_;
      local_3048 = local_1d8.p_;
      local_3080._32_16_ =
           (undefined1  [16])
           boost::unordered::
           unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x1cbc13);
      bVar1 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)this_02,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)this_01);
      if (bVar1) {
        std::
        optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::operator*((optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                     *)0x1cbc5e);
        generateRandomAlphanumericString<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  (in_stack_ffffffffffffcd08,(size_t)in_stack_ffffffffffffcd00);
        args_01 = local_1c50;
        local_2d8 = &local_3028;
        local_2e0 = (SyntaxPrinter *)local_3080;
        local_2d0 = args_01;
        local_148._M_string_length = (size_type)local_2e0;
        local_148.field_2._M_allocated_capacity = (size_type)local_2d8;
        local_148.field_2._8_8_ = args_01;
        paVar3 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x1cbcea);
        pbVar10 = &local_148;
        boost::unordered::detail::foa::
        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
        ::alloc_cted_or_fwded_key_type
                  ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
                    *)pbVar10,paVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_148.field_2._M_allocated_capacity);
        local_78 = boost::unordered::detail::foa::
                   alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
                   ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
                                  *)pbVar10);
        local_70 = &local_149;
        local_80 = (SyntaxPrinter *)local_148._M_string_length;
        ptVar11 = args_01;
        local_68 = args_01;
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::key_from<std::__cxx11::string,std::__cxx11::string>
                             (local_78,local_148._M_string_length);
        this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     ::hash_for<std::__cxx11::string>
                               ((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)this_02,&this_01->buffer);
        local_90 = this_00;
        args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)this_02,(size_t)this_01);
        local_10 = local_88;
        local_20 = local_90;
        hash_00 = ptVar11;
        local_98 = args_2;
        local_18 = args_2;
        local_8 = ptVar11;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,(size_t)args_2);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::groups((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)0x1cbe58);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_ffffffffffffccb8,(size_t)this_02);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::elements((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)0x1cbead);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_ffffffffffffccf8 =
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)0x1cbefd);
              in_stack_ffffffffffffcd00 = local_10;
              in_stack_ffffffffffffcd08 =
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      ::key_from<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x1cbf2a);
              bVar1 = std::
                      equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)this_02,&this_01->buffer,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x1cbf45);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                goto LAB_001cc031;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_ffffffffffffccf7 =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)this_02
                                   ,(size_t)this_01);
          if ((bool)in_stack_ffffffffffffccf7) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::table_locator(&local_b0);
            goto LAB_001cc031;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(ptVar11 + 8));
        } while (bVar1);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::table_locator(&local_b0);
LAB_001cc031:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_b0);
        if (bVar1) {
          local_c0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::make_iterator((locator *)0x1cc051);
          local_c1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_3098,&local_c0,&local_c1);
        }
        else if (*(ulong *)(hash_00 + 0x28) < *(ulong *)(hash_00 + 0x20)) {
          this_01 = local_80;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)TVar8.info,CONCAT17(in_stack_ffffffffffffccdf,in_stack_ffffffffffffccd8),
                     (size_t)in_stack_ffffffffffffccd0,in_stack_ffffffffffffccc8,
                     in_stack_ffffffffffffccc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffccf7,in_stack_ffffffffffffccf0));
          local_d8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::make_iterator((locator *)0x1cc0f3);
          local_f1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_3098,&local_d8,local_f1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                    (this_00,(size_t)hash_00,args_01,pbVar10,args_2);
          local_108 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::make_iterator((locator *)0x1cc16e);
          local_121[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_3098,&local_108,local_121);
        }
        local_3050 = local_3098.first.pc_;
        local_3048 = local_3098.first.p_;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)this_02);
      alloc_00 = TVar8._0_8_;
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      sVar7._M_str = (char *)in_stack_ffffffffffffcd00;
      sVar7._M_len = (size_t)in_stack_ffffffffffffccf8;
      TVar8 = parsing::Token::withRawText
                        ((Token *)CONCAT17(in_stack_ffffffffffffccf7,in_stack_ffffffffffffccf0),
                         alloc_00,sVar7);
      local_2fe8 = TVar8;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
    }
    TVar6.info = in_stack_ffffffffffffce60;
    TVar6.kind = (short)in_stack_ffffffffffffce58;
    TVar6._2_1_ = (char)((ulong)in_stack_ffffffffffffce58 >> 0x10);
    TVar6.numFlags.raw = (char)((ulong)in_stack_ffffffffffffce58 >> 0x18);
    TVar6.rawLen = (int)((ulong)in_stack_ffffffffffffce58 >> 0x20);
    slang::syntax::SyntaxPrinter::print(in_stack_ffffffffffffce50,TVar6);
  } while (local_2fe8.kind != EndOfFile);
  aVar4.values_ = (value<fmt::v11::context> *)SmallVectorBase<slang::Diagnostic>::begin(local_460);
  pDVar5 = SmallVectorBase<slang::Diagnostic>::end(local_460);
  do {
    if ((iterator)aVar4.values_ == pDVar5) {
      pcVar12 = "{}\n";
      slang::syntax::SyntaxPrinter::str_abi_cxx11_(this_01);
      local_280 = local_3190;
      uStack_288 = 3;
      local_298 = local_31c0;
      uStack_2a0 = 3;
      local_2a8 = pcVar12;
      local_290 = pcVar12;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_ffffffffffffccc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffccb8);
      local_208 = &local_2b8;
      local_210 = local_2c8;
      local_2b8 = 0xd;
      fmt_00.size_ = (size_t)aVar4.values_;
      fmt_00.data_ = (char *)pDVar5;
      args_00.field_1.values_ = in_stack_ffffffffffffcf18.values_;
      args_00.desc_ = in_stack_ffffffffffffcf10;
      local_2b0 = local_210;
      ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      text_00._M_str = (char *)in_stack_ffffffffffffccc0;
      text_00._M_len = (size_t)in_stack_ffffffffffffccb8;
      OS::print(text_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      local_301 = 1;
LAB_001cc765:
      boost::unordered::
      unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_flat_map
                ((unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x1cc772);
      slang::syntax::SyntaxPrinter::~SyntaxPrinter((SyntaxPrinter *)0x1cc77f);
      std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::~vector
                ((vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> *)
                 in_stack_ffffffffffffccc0);
      parsing::Preprocessor::~Preprocessor(this_02);
      Diagnostics::~Diagnostics((Diagnostics *)0x1cc7a6);
      BumpAllocator::~BumpAllocator((BumpAllocator *)this_02);
      Bag::~Bag((Bag *)0x1cc7c0);
      return (bool)(local_301 & 1);
    }
    aVar13 = aVar4;
    bVar1 = Diagnostic::isError((Diagnostic *)this_02);
    if (bVar1) {
      local_3128 = "{}";
      local_3120 = 2;
      std::span<const_slang::Diagnostic,_18446744073709551615UL>::span<slang::Diagnostics_&>
                ((span<const_slang::Diagnostic,_18446744073709551615UL> *)in_stack_ffffffffffffccc0,
                 (Diagnostics *)in_stack_ffffffffffffccb8);
      DiagnosticEngine::reportAll_abi_cxx11_(in_stack_ffffffffffffce88,in_stack_ffffffffffffce90);
      local_228 = local_3118;
      local_238 = local_3128;
      uStack_230 = local_3120;
      local_240 = local_3148;
      local_258 = local_3128;
      uStack_250 = local_3120;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_ffffffffffffccc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffccb8);
      local_218 = &local_268;
      local_220 = local_278;
      local_268 = 0xd;
      fmt.size_ = (size_t)aVar13.values_;
      fmt.data_ = (char *)pDVar5;
      args.field_1.values_ = aVar4.values_;
      args.desc_ = in_stack_ffffffffffffcf10;
      local_260 = local_220;
      ::fmt::v11::vformat_abi_cxx11_(fmt,args);
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_02);
      local_30f8 = _Var9._M_len;
      text._M_str = (char *)in_stack_ffffffffffffccc0;
      text._M_len = (size_t)in_stack_ffffffffffffccb8;
      OS::printE(text);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
      local_301 = 0;
      goto LAB_001cc765;
    }
    in_stack_ffffffffffffcf18 = aVar4;
    aVar4.values_ = aVar13.values_ + 7;
  } while( true );
}

Assistant:

bool Driver::runPreprocessor(bool includeComments, bool includeDirectives, bool obfuscateIds,
                             bool useFixedObfuscationSeed) {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    SyntaxPrinter output;
    output.setIncludeComments(includeComments);
    output.setIncludeDirectives(includeDirectives);

    std::optional<std::mt19937> rng;
    flat_hash_map<std::string, std::string> obfuscationMap;

    if (obfuscateIds) {
        if (useFixedObfuscationSeed)
            rng.emplace();
        else
            rng = createRandomGenerator<std::mt19937>();
    }

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::IntegerBase) {
            // This is needed for the case where obfuscation is enabled,
            // the digits of a vector literal may be lexed initially as
            // an identifier and we don't have the parser here to fix things
            // up for us.
            do {
                output.print(token);
                token = preprocessor.next();
            } while (SyntaxFacts::isPossibleVectorDigit(token.kind));
        }

        if (obfuscateIds && token.kind == TokenKind::Identifier) {
            auto name = std::string(token.valueText());
            auto translation = obfuscationMap.find(name);
            if (translation == obfuscationMap.end()) {
                auto newName = generateRandomAlphanumericString(*rng, 16);
                translation = obfuscationMap.emplace(name, newName).first;
            }
            token = token.withRawText(alloc, translation->second);
        }

        output.print(token);
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    // Only print diagnostics if actual errors occurred.
    for (auto& diag : diagnostics) {
        if (diag.isError()) {
            OS::printE(fmt::format("{}", DiagnosticEngine::reportAll(sourceManager, diagnostics)));
            return false;
        }
    }

    OS::print(fmt::format("{}\n", output.str()));
    return true;
}